

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_alloc.c
# Opt level: O3

void * bget(kmp_info_t *th,bufsize requested_size)

{
  bufsize *pbVar1;
  undefined8 *puVar2;
  bget_mode_t bVar3;
  thr_data_t *ptVar4;
  long lVar5;
  bget_acquire_t p_Var6;
  bfhead *pbVar7;
  bfhead *pbVar8;
  int hi;
  int iVar9;
  bfhead_t *b;
  ulong uVar10;
  size_t *psVar11;
  int iVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  bfhead *pbVar16;
  ulong uVar17;
  int iVar18;
  bfhead *b_00;
  long lVar19;
  size_t sVar20;
  
  if (0x7fffffffffffffd8 < (ulong)requested_size) {
    return (void *)0x0;
  }
  lVar14 = 0x10;
  if (0x10 < (ulong)requested_size) {
    lVar14 = requested_size;
  }
  uVar13 = lVar14 + 7U & 0x7ffffffffffffff8;
  sVar20 = uVar13 + 0x20;
  do {
    ptVar4 = *(thr_data_t **)(th->th_pad + 0x118);
    __kmp_bget_dequeue(th);
    bVar3 = ptVar4->mode;
    iVar18 = 0;
    do {
      iVar9 = 0x13;
      iVar12 = 0;
      do {
        iVar15 = iVar9 + iVar12 >> 1;
        if ((long)sVar20 < bget_bin_size[iVar15]) {
          iVar9 = iVar15 + -1;
          iVar15 = iVar12;
        }
        iVar12 = iVar15;
      } while (1 < iVar9 - iVar12);
      if (iVar12 < 0x14) {
        lVar14 = (long)iVar12;
        do {
          pbVar16 = ptVar4->freelist + lVar14;
          b_00 = (&(pbVar16->ql).flink)[bVar3 == bget_mode_lifo];
          pbVar8 = pbVar16;
          pbVar7 = b_00;
          if (ptVar4->mode == bget_mode_best) {
            for (; b_00 = pbVar8, pbVar7 != pbVar16;
                pbVar7 = (&(pbVar7->ql).flink)[bVar3 == bget_mode_lifo]) {
              lVar5 = (pbVar7->bh).bb.bsize;
              if (((long)sVar20 <= lVar5) && ((b_00 == pbVar16 || (lVar5 < (b_00->bh).bb.bsize)))) {
                b_00 = pbVar7;
              }
              pbVar8 = b_00;
            }
          }
          for (; b_00 != pbVar16; b_00 = (&(b_00->ql).flink)[bVar3 == bget_mode_lifo]) {
            lVar5 = (b_00->bh).bb.bsize;
            lVar19 = lVar5 - sVar20;
            if ((long)sVar20 <= lVar5) {
              if (lVar19 < 0x31) {
                pbVar7 = (b_00->ql).flink;
                pbVar8 = (b_00->ql).blink;
                (pbVar8->ql).flink = pbVar7;
                (pbVar7->ql).blink = pbVar8;
                ptVar4->totalloc = (b_00->bh).bb.bsize + ptVar4->totalloc;
                ptVar4->numget = ptVar4->numget + 1;
                pbVar1 = &(b_00->bh).bb.bsize;
                *pbVar1 = -*pbVar1;
                *(kmp_info_t **)((long)&b_00->bh + lVar5) = th;
                *(undefined8 *)((long)&b_00->bh + lVar5 + 8) = 0;
                return &b_00->ql;
              }
              (b_00->bh).bb.bsize = lVar19;
              puVar2 = (undefined8 *)((long)b_00 + lVar19);
              puVar2[1] = lVar19;
              puVar2[2] = -0x20 - uVar13;
              *puVar2 = th;
              *(undefined8 *)((long)&b_00->bh + lVar5 + 8) = 0;
              pbVar7 = (b_00->ql).flink;
              pbVar8 = (b_00->ql).blink;
              (pbVar8->ql).flink = pbVar7;
              (pbVar7->ql).blink = pbVar8;
              __kmp_bget_insert_into_freelist(ptVar4,b_00);
              ptVar4->totalloc = sVar20 + ptVar4->totalloc;
              ptVar4->numget = ptVar4->numget + 1;
              return puVar2 + 4;
            }
          }
          lVar14 = lVar14 + 1;
        } while ((int)lVar14 != 0x14);
      }
      if (ptVar4->compfcn == (bget_compact_t)0x0) break;
      iVar18 = iVar18 + 1;
      iVar9 = (*ptVar4->compfcn)(sVar20,iVar18);
    } while (iVar9 != 0);
    p_Var6 = ptVar4->acqfcn;
    if (p_Var6 == (bget_acquire_t)0x0) {
      return (void *)0x0;
    }
    if ((long)(ptVar4->exp_incr - 0x20U) < (long)sVar20) {
      sVar20 = uVar13 + 0x28;
      psVar11 = (size_t *)(*p_Var6)(sVar20);
      if (psVar11 == (size_t *)0x0) {
        return (void *)0x0;
      }
      psVar11[1] = (size_t)th;
      *(undefined1 (*) [16])(psVar11 + 2) = (undefined1  [16])0x0;
      *psVar11 = sVar20;
      ptVar4->totalloc = sVar20 + ptVar4->totalloc;
      ptVar4->numget = ptVar4->numget + 1;
      ptVar4->numdget = ptVar4->numdget + 1;
      return psVar11 + 5;
    }
    b = (bfhead_t *)(*p_Var6)(ptVar4->exp_incr);
    if (b == (bfhead_t *)0x0) {
      return (void *)0x0;
    }
    uVar17 = ptVar4->exp_incr;
    ptVar4 = *(thr_data_t **)(th->th_pad + 0x118);
    __kmp_bget_dequeue(th);
    uVar17 = uVar17 & 0xfffffffffffffff8;
    uVar10 = uVar17;
    if ((ptVar4->pool_len == 0) || (uVar10 = 0xffffffffffffffff, uVar17 != ptVar4->pool_len)) {
      ptVar4->pool_len = uVar10;
    }
    ptVar4->numpblk = ptVar4->numpblk + 1;
    ptVar4->numpget = ptVar4->numpget + 1;
    (b->bh).bb.prevfree = 0;
    (b->bh).bb.bsize = uVar17 - 0x20;
    (b->bh).bb.bthr = (kmp_info_t *)((ulong)th | 1);
    __kmp_bget_insert_into_freelist(ptVar4,b);
    *(ulong *)((long)b + (uVar17 - 0x18)) = uVar17 - 0x20;
    *(undefined8 *)((long)b + (uVar17 - 0x10)) = 0x8000000000000000;
  } while( true );
}

Assistant:

static void *
bget(  kmp_info_t *th, bufsize requested_size )
{
    thr_data_t *thr = get_thr_data( th );
    bufsize size = requested_size;
    bfhead_t *b;
    void *buf;
    int compactseq = 0;
    int use_blink = 0;
/* For BestFit */
    bfhead_t *best;

    if ( size < 0 || size + sizeof( bhead_t ) > MaxSize ) {
        return NULL;
    }; // if

    __kmp_bget_dequeue( th );         /* Release any queued buffers */

    if (size < (bufsize)SizeQ) {      /* Need at least room for the */
        size = SizeQ;                 /*    queue links.  */
    }
    #if defined( SizeQuant ) && ( SizeQuant > 1 )
        size = (size + (SizeQuant - 1)) & (~(SizeQuant - 1));
    #endif

    size += sizeof(bhead_t);     /* Add overhead in allocated buffer
                                         to size required. */
    KMP_DEBUG_ASSERT( size >= 0 );
    KMP_DEBUG_ASSERT( size % SizeQuant == 0 );

    use_blink = ( thr->mode == bget_mode_lifo );

    /* If a compact function was provided in the call to bectl(), wrap
       a loop around the allocation process  to  allow  compaction  to
       intervene in case we don't find a suitable buffer in the chain. */

    for (;;) {
        int bin;

        for (bin = bget_get_bin( size ); bin < MAX_BGET_BINS; ++bin) {
            /* Link to next buffer */
            b = ( use_blink ? thr->freelist[ bin ].ql.blink : thr->freelist[ bin ].ql.flink );

            if (thr->mode == bget_mode_best) {
                best = &thr->freelist[ bin ];

                /* Scan the free list searching for the first buffer big enough
                   to hold the requested size buffer. */

                while (b != &thr->freelist[ bin ]) {
                    if (b->bh.bb.bsize >= (bufsize) size) {
                        if ((best == &thr->freelist[ bin ]) || (b->bh.bb.bsize < best->bh.bb.bsize)) {
                            best = b;
                        }
                    }

                    /* Link to next buffer */
                    b = ( use_blink ? b->ql.blink : b->ql.flink );
                }
                b = best;
            }

            while (b != &thr->freelist[ bin ]) {
                if ((bufsize) b->bh.bb.bsize >= (bufsize) size) {

                    /* Buffer  is big enough to satisfy  the request.  Allocate it
                       to the caller.  We must decide whether the buffer is  large
                       enough  to  split  into  the part given to the caller and a
                       free buffer that remains on the free list, or  whether  the
                       entire  buffer  should  be  removed  from the free list and
                       given to the caller in its entirety.   We  only  split  the
                       buffer if enough room remains for a header plus the minimum
                       quantum of allocation. */

                    if ((b->bh.bb.bsize - (bufsize) size) > (bufsize)(SizeQ + (sizeof(bhead_t)))) {
                        bhead_t *ba, *bn;

                        ba = BH(((char *) b) + (b->bh.bb.bsize - (bufsize) size));
                        bn = BH(((char *) ba) + size);

                        KMP_DEBUG_ASSERT(bn->bb.prevfree == b->bh.bb.bsize);

                        /* Subtract size from length of free block. */
                        b->bh.bb.bsize -= (bufsize) size;

                        /* Link allocated buffer to the previous free buffer. */
                        ba->bb.prevfree = b->bh.bb.bsize;

                        /* Plug negative size into user buffer. */
                        ba->bb.bsize = -size;

                        /* Mark this buffer as owned by this thread. */
                        TCW_PTR(ba->bb.bthr, th);   // not an allocated address (do not mark it)
                        /* Mark buffer after this one not preceded by free block. */
                        bn->bb.prevfree = 0;

                        /* unlink the buffer from the old freelist, and reinsert it into the new freelist */
                        __kmp_bget_remove_from_freelist( b );
                        __kmp_bget_insert_into_freelist( thr, b );
#if BufStats
                        thr->totalloc += (size_t) size;
                        thr->numget++;        /* Increment number of bget() calls */
#endif
                        buf = (void *) ((((char *) ba) + sizeof(bhead_t)));
                        KMP_DEBUG_ASSERT( ((size_t)buf) % SizeQuant == 0 );
                        return buf;
                    } else {
                        bhead_t *ba;

                        ba = BH(((char *) b) + b->bh.bb.bsize);

                        KMP_DEBUG_ASSERT(ba->bb.prevfree == b->bh.bb.bsize);

                        /* The buffer isn't big enough to split.  Give  the  whole
                           shebang to the caller and remove it from the free list. */

                       __kmp_bget_remove_from_freelist( b );
#if BufStats
                        thr->totalloc += (size_t) b->bh.bb.bsize;
                        thr->numget++;        /* Increment number of bget() calls */
#endif
                        /* Negate size to mark buffer allocated. */
                        b->bh.bb.bsize = -(b->bh.bb.bsize);

                        /* Mark this buffer as owned by this thread. */
                        TCW_PTR(ba->bb.bthr, th);   // not an allocated address (do not mark it)
                        /* Zero the back pointer in the next buffer in memory
                           to indicate that this buffer is allocated. */
                        ba->bb.prevfree = 0;

                        /* Give user buffer starting at queue links. */
                        buf =  (void *) &(b->ql);
                        KMP_DEBUG_ASSERT( ((size_t)buf) % SizeQuant == 0 );
                        return buf;
                    }
                }

                /* Link to next buffer */
                b = ( use_blink ? b->ql.blink : b->ql.flink );
            }
        }

        /* We failed to find a buffer.  If there's a compact  function
           defined,  notify  it  of the size requested.  If it returns
           TRUE, try the allocation again. */

        if ((thr->compfcn == 0) || (!(*thr->compfcn)(size, ++compactseq))) {
            break;
        }
    }

    /* No buffer available with requested size free. */

    /* Don't give up yet -- look in the reserve supply. */

    if (thr->acqfcn != 0) {
        if (size > (bufsize) (thr->exp_incr - sizeof(bhead_t))) {

            /* Request  is  too  large  to  fit in a single expansion
               block.  Try to satisy it by a direct buffer acquisition. */

            bdhead_t *bdh;

            size += sizeof(bdhead_t) - sizeof(bhead_t);

            KE_TRACE( 10, ("%%%%%% MALLOC( %d )\n", (int) size ) );

            /* richryan */
            bdh = BDH((*thr->acqfcn)((bufsize) size));
            if (bdh != NULL) {

                /*  Mark the buffer special by setting the size field
                    of its header to zero.  */
                bdh->bh.bb.bsize = 0;

                /* Mark this buffer as owned by this thread. */
                TCW_PTR(bdh->bh.bb.bthr, th);  // don't mark buffer as allocated,
                                               // because direct buffer never goes to free list
                bdh->bh.bb.prevfree = 0;
                bdh->tsize = size;
#if BufStats
                thr->totalloc += (size_t) size;
                thr->numget++;        /* Increment number of bget() calls */
                thr->numdget++;       /* Direct bget() call count */
#endif
                buf =  (void *) (bdh + 1);
                KMP_DEBUG_ASSERT( ((size_t)buf) % SizeQuant == 0 );
                return buf;
            }

        } else {

            /*  Try to obtain a new expansion block */

            void *newpool;

            KE_TRACE( 10, ("%%%%%% MALLOCB( %d )\n", (int) thr->exp_incr ) );

            /* richryan */
            newpool = (*thr->acqfcn)((bufsize) thr->exp_incr);
            KMP_DEBUG_ASSERT( ((size_t)newpool) % SizeQuant == 0 );
            if (newpool != NULL) {
                bpool( th, newpool, thr->exp_incr);
                buf =  bget( th, requested_size);  /* This can't, I say, can't get into a loop. */
                return buf;
            }
        }
    }

    /*  Still no buffer available */

    return NULL;
}